

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

void CoreML::KNNValidatorTests::addDataPoints(KNearestNeighborsClassifier *nnModel)

{
  void *pvVar1;
  NearestNeighborsIndex *this;
  Type *pTVar2;
  size_t i;
  size_t j;
  long lVar3;
  int iVar4;
  pointer pvVar5;
  long lVar6;
  float fVar7;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_05;
  vector<float,_std::allocator<float>_> point2b;
  vector<float,_std::allocator<float>_> point2;
  vector<float,_std::allocator<float>_> point1b;
  vector<float,_std::allocator<float>_> point1;
  vector<float,_std::allocator<float>_> point0b;
  vector<float,_std::allocator<float>_> point0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  allocator_type local_175;
  float local_174;
  vector<float,_std::allocator<float>_> local_170;
  vector<float,_std::allocator<float>_> local_158;
  vector<float,_std::allocator<float>_> local_140;
  vector<float,_std::allocator<float>_> local_128;
  vector<float,_std::allocator<float>_> local_110;
  vector<float,_std::allocator<float>_> local_f8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_e0;
  vector<float,_std::allocator<float>_> local_c8;
  vector<float,_std::allocator<float>_> local_b0;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_f8,__l,(allocator_type *)&local_110);
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3dcccccd00000000;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_110,__l_00,(allocator_type *)&local_128)
  ;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_128,__l_01,(allocator_type *)&local_140)
  ;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3dcccccd;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_140,__l_02,(allocator_type *)&local_158)
  ;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40066666;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_158,__l_03,(allocator_type *)&local_170)
  ;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40066666;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3dcccccd00000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_c8;
  std::vector<float,_std::allocator<float>_>::vector(&local_170,__l_04,(allocator_type *)&local_e0);
  std::vector<float,_std::allocator<float>_>::vector(&local_c8,&local_f8);
  std::vector<float,_std::allocator<float>_>::vector(&local_b0,&local_128);
  std::vector<float,_std::allocator<float>_>::vector(&local_98,&local_158);
  std::vector<float,_std::allocator<float>_>::vector(&local_80,&local_110);
  std::vector<float,_std::allocator<float>_>::vector(&local_68,&local_140);
  std::vector<float,_std::allocator<float>_>::vector(&local_50,&local_170);
  __l_05._M_len = 6;
  __l_05._M_array = &local_c8;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_e0,__l_05,&local_175);
  lVar6 = 0x90;
  do {
    pvVar1 = *(void **)((long)&local_e0.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_e0.
                                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  this = nnModel->nearestneighborsindex_;
  if (this == (NearestNeighborsIndex *)0x0) {
    this = (NearestNeighborsIndex *)operator_new(0x50);
    Specification::NearestNeighborsIndex::NearestNeighborsIndex(this);
    nnModel->nearestneighborsindex_ = this;
  }
  this->numberofdimensions_ = 4;
  lVar6 = 0;
  do {
    google::protobuf::internal::RepeatedPtrFieldBase::
    Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
              (&(this->floatsamples_).super_RepeatedPtrFieldBase,(Type *)0x0);
    pvVar5 = local_e0.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6;
    lVar3 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&(this->floatsamples_).super_RepeatedPtrFieldBase,(int)lVar6);
      fVar7 = (pvVar5->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      iVar4 = (pTVar2->vector_).current_size_;
      if (iVar4 == (pTVar2->vector_).total_size_) {
        local_174 = fVar7;
        google::protobuf::RepeatedField<float>::Reserve(&pTVar2->vector_,iVar4 + 1);
        iVar4 = (pTVar2->vector_).current_size_;
        fVar7 = local_174;
      }
      (pTVar2->vector_).current_size_ = iVar4 + 1;
      ((pTVar2->vector_).rep_)->elements[iVar4] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_e0);
  if (local_170.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addDataPoints(Specification::KNearestNeighborsClassifier* nnModel) {

        std::vector<float> point0 = {0, 0, 0, 0};
        std::vector<float> point0b = {0, 0.1f, 0, 0};

        std::vector<float> point1 = {1, 0, 0, 0};
        std::vector<float> point1b = {1, 0, 0.1f, 0};

        std::vector<float> point2 = {2.1f, 0, 0, 0};
        std::vector<float> point2b = {2.1f, 0, 0, 0.1f};

        std::vector<std::vector<float>> points = {point0, point1, point2, point0b, point1b, point2b};
        size_t pointCount = 6;

        auto *nnIndex = nnModel->mutable_nearestneighborsindex();
        nnIndex->set_numberofdimensions(4);

        for (size_t i = 0; i < pointCount; i++) {
            nnIndex->add_floatsamples();
            const auto& sample = points[i];
            for (size_t j = 0; j < 4; j++) {
                nnIndex->mutable_floatsamples((int)i)->add_vector(sample[j]);
            }
        }

    }